

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O3

int proc_read(char *filename,char *buff,size_t buffsize)

{
  int fd;
  uint uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  fd = open(filename,0);
  uVar1 = 0;
  if (-1 < fd) {
    uVar1 = unix_read(fd,buff,(int)buffsize + -1);
    close(fd);
  }
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  buff[uVar2] = '\0';
  return uVar1;
}

Assistant:

static int
proc_read(const char*  filename, char* buff, size_t  buffsize)
{
    int  len = 0;
    int  fd  = open(filename, O_RDONLY);
    if (fd >= 0) {
        len = unix_read(fd, buff, buffsize-1);
        close(fd);
    }
    buff[len > 0 ? len : 0] = 0;
    return len;
}